

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<Edge> * __thiscall vector<Edge>::operator=(vector<Edge> *this,vector<Edge> *other)

{
  uint uVar1;
  int iVar2;
  Edge *pEVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = other->_size;
  this->_size = uVar1;
  iVar2 = other->_capacity;
  uVar8 = (ulong)iVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  uVar5 = SUB168(auVar4 * ZEXT816(0xc),0);
  uVar7 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar7 = 0xffffffffffffffff;
  }
  this->_capacity = iVar2;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
    uVar5 = uVar7;
  }
  puVar6 = (ulong *)operator_new__(uVar5);
  *puVar6 = uVar8;
  if (iVar2 != 0) {
    uVar7 = uVar8 * 0xc - 0xc;
    memset((Edge *)(puVar6 + 1),0,(uVar7 - uVar7 % 0xc) + 0xc);
  }
  this->vect = (Edge *)(puVar6 + 1);
  pEVar3 = other->vect;
  uVar5 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 * 0xc - uVar5 != 0; uVar5 = uVar5 + 0xc) {
    *(undefined8 *)((long)puVar6 + uVar5 + 8) = *(undefined8 *)((long)&pEVar3->_nodeS + uVar5);
    *(undefined4 *)((long)puVar6 + uVar5 + 0x10) = *(undefined4 *)((long)&pEVar3->_cost + uVar5);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }